

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_util.c
# Opt level: O0

int get_tempdir(archive_string *temppath)

{
  size_t local_30;
  char *local_18;
  char *tmp;
  archive_string *temppath_local;
  
  local_18 = getenv("TMPDIR");
  if (local_18 == (char *)0x0) {
    local_18 = "/tmp";
  }
  temppath->length = 0;
  if (local_18 == (char *)0x0) {
    local_30 = 0;
  }
  else {
    local_30 = strlen(local_18);
  }
  archive_strncat(temppath,local_18,local_30);
  if (temppath->s[temppath->length - 1] != '/') {
    archive_strappend_char(temppath,'/');
  }
  return 0;
}

Assistant:

static int
get_tempdir(struct archive_string *temppath)
{
	const char *tmp;

	tmp = getenv("TMPDIR");
	if (tmp == NULL)
#ifdef _PATH_TMP
		tmp = _PATH_TMP;
#else
                tmp = "/tmp";
#endif
	archive_strcpy(temppath, tmp);
	if (temppath->s[temppath->length-1] != '/')
		archive_strappend_char(temppath, '/');
	return (ARCHIVE_OK);
}